

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O2

C_matrix<double> * __thiscall
C_matrix<double>::operator=
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,C_matrix<double> *c)

{
  int iVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (this != c) {
    if ((c->m_C != this->m_C) || (c->m_L != this->m_L)) {
      resize(this,c->m_L,c->m_C);
    }
    uVar4 = 0;
    while (uVar3 = uVar4 & 0xffff, (int)uVar3 < this->m_L) {
      iVar1 = this->m_C;
      uVar6 = 0;
      while (uVar5 = uVar6 & 0xffff, (int)uVar5 < iVar1) {
        pdVar2 = operator()(c,(unsigned_short)uVar4,(unsigned_short)uVar6);
        iVar1 = this->m_C;
        this->m_A[(int)(iVar1 * uVar3 + uVar5)] = *pdVar2;
        uVar6 = uVar5 + 1;
      }
      uVar4 = uVar3 + 1;
    }
  }
  C_matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator= (C_matrix const& c)
{
    if(this==&c)return *this;

    if(c.getNbColumn()!=this->getNbColumn() || c.getNbRow()!=this->getNbRow())
    {
        this->resize(c.getNbRow(),c.getNbColumn());
        //throw "dimension matrix must agree";
    }

    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            this->m_A[getIndex(i,j)] = c(i,j);
        }
    }
    return *this;
}